

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepulsivePower.cpp
# Opt level: O3

void __thiscall
OpenMD::RepulsivePower::addExplicitInteraction
          (RepulsivePower *this,AtomType *atype1,AtomType *atype2,RealType sigma,RealType epsilon,
          int nRep)

{
  pointer piVar1;
  pointer pvVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  size_type __new_size;
  int iVar9;
  long lVar10;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar11;
  int atid2;
  int atid1;
  int local_44;
  RealType local_40;
  int local_34;
  
  iVar6 = (int)(this->RPtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_40 = epsilon;
  local_34 = AtomType::getIdent(atype1);
  local_44 = AtomType::getIdent(atype2);
  pVar11 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
           _M_insert_unique<int_const&>
                     ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      &this->RPtypes,&local_34);
  piVar1 = (this->RPtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVar11.second == false) {
    iVar9 = piVar1[local_34];
    iVar7 = iVar6;
  }
  else {
    piVar1[local_34] = iVar6;
    iVar7 = iVar6 + 1;
    iVar9 = iVar6;
  }
  pVar11 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
           _M_insert_unique<int_const&>
                     ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      &this->RPtypes,&local_44);
  piVar1 = (this->RPtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVar11.second == false) {
    iVar6 = piVar1[local_44];
    iVar8 = iVar7;
  }
  else {
    piVar1[local_44] = iVar7;
    iVar8 = iVar7 + 1;
    iVar6 = iVar7;
  }
  __new_size = (size_type)iVar8;
  std::
  vector<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
  ::resize(&this->MixingMap,__new_size);
  lVar10 = (long)iVar9;
  std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar10,__new_size);
  pvVar2 = (this->MixingMap).
           super__Vector_base<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)iVar6;
  lVar3 = *(long *)&pvVar2[lVar10].
                    super__Vector_base<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar5 = lVar4 * 0x20;
  *(RealType *)(lVar3 + lVar5) = sigma;
  *(RealType *)(lVar3 + 8 + lVar5) = local_40;
  *(double *)(lVar3 + 0x10 + lVar5) = 1.0 / sigma;
  *(int *)(lVar3 + 0x18 + lVar5) = nRep;
  if (iVar6 != iVar9) {
    std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>::resize
              (pvVar2 + lVar4,__new_size);
    lVar3 = *(long *)&(this->MixingMap).
                      super__Vector_base<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar4].
                      super__Vector_base<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>
                      ._M_impl.super__Vector_impl_data;
    lVar10 = lVar10 * 0x20;
    *(RealType *)(lVar3 + lVar10) = sigma;
    *(RealType *)(lVar3 + 8 + lVar10) = local_40;
    *(double *)(lVar3 + 0x10 + lVar10) = 1.0 / sigma;
    *(int *)(lVar3 + 0x18 + lVar10) = nRep;
  }
  return;
}

Assistant:

void RepulsivePower::addExplicitInteraction(AtomType* atype1,
                                              AtomType* atype2, RealType sigma,
                                              RealType epsilon, int nRep) {
    RPInteractionData mixer;
    mixer.sigma   = sigma;
    mixer.epsilon = epsilon;
    mixer.sigmai  = 1.0 / mixer.sigma;
    mixer.nRep    = nRep;

    int nRP   = RPtypes.size();
    int atid1 = atype1->getIdent();
    int atid2 = atype2->getIdent();
    int rptid1, rptid2;

    pair<set<int>::iterator, bool> ret;
    ret = RPtypes.insert(atid1);
    if (ret.second == false) {
      // already had this type in the MieMap, just get the mietid:
      rptid1 = RPtids[atid1];
    } else {
      // didn't already have it, so make a new one and assign it:
      rptid1        = nRP;
      RPtids[atid1] = nRP;
      nRP++;
    }

    ret = RPtypes.insert(atid2);
    if (ret.second == false) {
      // already had this type in the MieMap, just get the mietid:
      rptid2 = RPtids[atid2];
    } else {
      // didn't already have it, so make a new one and assign it:
      rptid2        = nRP;
      RPtids[atid2] = nRP;
      nRP++;
    }

    MixingMap.resize(nRP);
    MixingMap[rptid1].resize(nRP);

    MixingMap[rptid1][rptid2] = mixer;
    if (rptid2 != rptid1) {
      MixingMap[rptid2].resize(nRP);
      MixingMap[rptid2][rptid1] = mixer;
    }
  }